

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall helics::CommsInterface::setFlag(CommsInterface *this,string_view flag,bool val)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view message_00;
  byte bVar1;
  bool bVar2;
  byte in_CL;
  char *in_RSI;
  CommsInterface *in_RDI;
  string message;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff78 [16];
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffe0;
  CommsInterface *pCVar3;
  
  bVar1 = in_CL & 1;
  pCVar3 = in_RDI;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff78._8_8_,in_stack_ffffffffffffff78._0_8_);
  __x._M_str = (char *)in_stack_ffffffffffffffa0;
  __x._M_len = in_stack_ffffffffffffff98;
  __y._M_str = (char *)in_stack_ffffffffffffff90;
  __y._M_len = (size_t)in_stack_ffffffffffffff88;
  bVar2 = std::operator==(__x,__y);
  if (bVar2) {
    setServerMode(in_RDI,SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    message_00._M_str = in_RSI;
    message_00._M_len = (size_t)pCVar3;
    logWarning((CommsInterface *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),message_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  }
  return;
}

Assistant:

void CommsInterface::setFlag(std::string_view flag, bool val)
{
    if (flag == "server_mode") {
        setServerMode(val);
    } else {
        std::string message("unrecognized flag :");
        message.append(flag);
        logWarning(message);
    }
}